

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-unix-sysdep.c
# Opt level: O2

void sysdep_save_fp_ctrl_state(__cilkrts_stack_frame *sf)

{
  uint16_t in_FPUControlWord;
  
  if (0xffffff < sf->flags) {
    sf->mxcsr = MXCSR;
    sf->fpcsr = in_FPUControlWord;
  }
  return;
}

Assistant:

void sysdep_save_fp_ctrl_state(__cilkrts_stack_frame *sf)
{
// If we're not going to restore, don't bother saving it
#ifdef RESTORE_X86_FP_STATE
    if (CILK_FRAME_VERSION_VALUE(sf->flags) >= 1)
    {
        if (__builtin_cpu_supports("sse"))
        {
            __asm__ ("stmxcsr %0" : "=m" (sf->mxcsr));
        }
        __asm__ ("fnstcw %0" : "=m" (sf->fpcsr));
    }
#endif
}